

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.hpp
# Opt level: O0

void __thiscall
mio::basic_mmap<(mio::access_mode)0,_char>::map
          (basic_mmap<(mio::access_mode)0,_char> *this,handle_type handle,size_type offset,
          size_type length,error_code *error)

{
  bool bVar1;
  size_t sVar2;
  error_code eVar3;
  size_type local_90;
  undefined1 local_70 [8];
  mmap_context ctx;
  size_t file_size;
  error_code *error_local;
  size_type length_local;
  size_type offset_local;
  handle_type handle_local;
  basic_mmap<(mio::access_mode)0,_char> *this_local;
  
  std::error_code::clear(error);
  if (handle == -1) {
    eVar3 = std::make_error_code(bad_file_descriptor);
    *(ulong *)error = CONCAT44(file_size._4_4_,eVar3._M_value);
    error->_M_cat = eVar3._M_cat;
  }
  else {
    sVar2 = detail::query_file_size(handle,error);
    bVar1 = std::error_code::operator_cast_to_bool(error);
    if (!bVar1) {
      if (sVar2 < offset + length) {
        eVar3 = std::make_error_code(invalid_argument);
        *(ulong *)error = CONCAT44(ctx.mapped_length._4_4_,eVar3._M_value);
        error->_M_cat = eVar3._M_cat;
      }
      else {
        local_90 = length;
        if (length == 0) {
          local_90 = sVar2 - offset;
        }
        detail::memory_map((mmap_context *)local_70,handle,offset,local_90,read,error);
        bVar1 = std::error_code::operator_cast_to_bool(error);
        if (!bVar1) {
          unmap(this);
          this->file_handle_ = handle;
          this->is_handle_internal_ = false;
          this->data_ = (pointer)local_70;
          this->length_ = (size_type)ctx.data;
          this->mapped_length_ = ctx.length;
        }
      }
    }
  }
  return;
}

Assistant:

void basic_mmap<AccessMode, ByteT>::map(const handle_type handle,
        const size_type offset, const size_type length, std::error_code& error)
{
    error.clear();
    if(handle == invalid_handle)
    {
        error = std::make_error_code(std::errc::bad_file_descriptor);
        return;
    }

    const auto file_size = detail::query_file_size(handle, error);
    if(error)
    {
        return;
    }

    if(offset + length > file_size)
    {
        error = std::make_error_code(std::errc::invalid_argument);
        return;
    }

    const auto ctx = detail::memory_map(handle, offset,
            length == map_entire_file ? (file_size - offset) : length,
            AccessMode, error);
    if(!error)
    {
        // We must unmap the previous mapping that may have existed prior to this call.
        // Note that this must only be invoked after a new mapping has been created in
        // order to provide the strong guarantee that, should the new mapping fail, the
        // `map` function leaves this instance in a state as though the function had
        // never been invoked.
        unmap();
        file_handle_ = handle;
        is_handle_internal_ = false;
        data_ = reinterpret_cast<pointer>(ctx.data);
        length_ = ctx.length;
        mapped_length_ = ctx.mapped_length;
#ifdef _WIN32
        file_mapping_handle_ = ctx.file_mapping_handle;
#endif
    }
}